

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

bool __thiscall cmComputeLinkInformation::Compute(cmComputeLinkInformation *this)

{
  _Rb_tree_header *p_Var1;
  cmGeneratorTarget *pcVar2;
  cmake *this_00;
  bool bVar3;
  TargetType TVar4;
  vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *pvVar5;
  char *val;
  _Base_ptr p_Var6;
  ostream *poVar7;
  string *psVar8;
  ArtifactType artifact;
  PolicyID id;
  LinkType lt;
  pointer item;
  string lib;
  cmComputeLinkDepends cld;
  string local_468;
  string local_448;
  string *local_428;
  undefined1 local_420 [112];
  ios_base local_3b0 [264];
  cmComputeLinkDepends local_2a8;
  
  TVar4 = cmGeneratorTarget::GetType(this->Target);
  if ((((TVar4 != EXECUTABLE) &&
       (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 != SHARED_LIBRARY)) &&
      (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 != MODULE_LIBRARY)) &&
     (TVar4 = cmGeneratorTarget::GetType(this->Target), TVar4 != STATIC_LIBRARY)) {
    return false;
  }
  if ((this->LinkLanguage)._M_string_length == 0) {
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    bVar3 = false;
    cmSystemTools::Error
              ("CMake can not determine linker language for target: ",(psVar8->_M_dataplus)._M_p,
               (char *)0x0,(char *)0x0);
  }
  else {
    local_428 = &this->Config;
    cmComputeLinkDepends::cmComputeLinkDepends(&local_2a8,this->Target,local_428);
    cmComputeLinkDepends::SetOldLinkDirMode(&local_2a8,this->OldLinkDirMode);
    pvVar5 = cmComputeLinkDepends::Compute(&local_2a8);
    for (item = (pvVar5->
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                )._M_impl.super__Vector_impl_data._M_start;
        item != (pvVar5->
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                )._M_impl.super__Vector_impl_data._M_finish; item = item + 1) {
      if (item->IsSharedDep == true) {
        AddSharedDepItem(this,&item->Item,item->Target);
      }
      else {
        AddItem(this,&item->Item,item->Target);
      }
    }
    pcVar2 = this->Target;
    local_420._0_8_ = local_420 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"LINK_SEARCH_END_STATIC","")
    ;
    val = cmGeneratorTarget::GetProperty(pcVar2,(string *)local_420);
    if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
      operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
    }
    bVar3 = cmSystemTools::IsOn(val);
    lt = LinkStatic;
    if (!bVar3) {
      lt = this->StartLinkType;
    }
    SetCurrentLinkType(this,lt);
    if ((this->OldLinkDirMode == true) &&
       (p_Var1 = &local_2a8.OldWrongConfigItems._M_t._M_impl.super__Rb_tree_header,
       (_Rb_tree_header *)
       local_2a8.OldWrongConfigItems._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1)
       ) {
      p_Var6 = local_2a8.OldWrongConfigItems._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        pcVar2 = *(cmGeneratorTarget **)(p_Var6 + 1);
        artifact = RuntimeBinaryArtifact;
        if (this->UseImportLibrary == true) {
          TVar4 = cmGeneratorTarget::GetType(pcVar2);
          artifact = (ArtifactType)(TVar4 == SHARED_LIBRARY);
        }
        cmGeneratorTarget::GetFullPath((string *)local_420,pcVar2,local_428,artifact,true);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->OldLinkDirItems,(string *)local_420);
        if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
          operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    bVar3 = FinishLinkerSearchDirectories(this);
    if ((bVar3) &&
       (AddImplicitLinkInfo(this),
       (this->CMP0060WarnItems)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_468,(cmPolicies *)0x3c,id);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_420,local_468._M_dataplus._M_p,local_468._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "\nSome library files are in directories implicitly searched by the linker when invoked for "
                 ,0x5a);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(this->LinkLanguage)._M_dataplus._M_p,
                          (this->LinkLanguage)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":\n ",3);
      cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                (&local_448,&this->CMP0060WarnItems,"\n ");
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_448._M_dataplus._M_p,local_448._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "\nFor compatibility with older versions of CMake, the generated link line will ask the linker to search for these by library name."
                 ,0x81);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      this_00 = this->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmGeneratorTarget::GetBacktrace((cmListFileBacktrace *)&local_448,this->Target);
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_468,(cmListFileBacktrace *)&local_448);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
      std::ios_base::~ios_base(local_3b0);
    }
    cmComputeLinkDepends::~cmComputeLinkDepends(&local_2a8);
  }
  return bVar3;
}

Assistant:

bool cmComputeLinkInformation::Compute()
{
  // Skip targets that do not link.
  if (!(this->Target->GetType() == cmStateEnums::EXECUTABLE ||
        this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::STATIC_LIBRARY)) {
    return false;
  }

  // We require a link language for the target.
  if (this->LinkLanguage.empty()) {
    cmSystemTools::Error(
      "CMake can not determine linker language for target: ",
      this->Target->GetName().c_str());
    return false;
  }

  // Compute the ordered link line items.
  cmComputeLinkDepends cld(this->Target, this->Config);
  cld.SetOldLinkDirMode(this->OldLinkDirMode);
  cmComputeLinkDepends::EntryVector const& linkEntries = cld.Compute();

  // Add the link line items.
  for (cmComputeLinkDepends::EntryVector::const_iterator lei =
         linkEntries.begin();
       lei != linkEntries.end(); ++lei) {
    if (lei->IsSharedDep) {
      this->AddSharedDepItem(lei->Item, lei->Target);
    } else {
      this->AddItem(lei->Item, lei->Target);
    }
  }

  // Restore the target link type so the correct system runtime
  // libraries are found.
  const char* lss = this->Target->GetProperty("LINK_SEARCH_END_STATIC");
  if (cmSystemTools::IsOn(lss)) {
    this->SetCurrentLinkType(LinkStatic);
  } else {
    this->SetCurrentLinkType(this->StartLinkType);
  }

  // Finish listing compatibility paths.
  if (this->OldLinkDirMode) {
    // For CMake 2.4 bug-compatibility we need to consider the output
    // directories of targets linked in another configuration as link
    // directories.
    std::set<cmGeneratorTarget const*> const& wrongItems =
      cld.GetOldWrongConfigItems();
    for (std::set<cmGeneratorTarget const*>::const_iterator i =
           wrongItems.begin();
         i != wrongItems.end(); ++i) {
      cmGeneratorTarget const* tgt = *i;
      bool implib = (this->UseImportLibrary &&
                     (tgt->GetType() == cmStateEnums::SHARED_LIBRARY));
      cmStateEnums::ArtifactType artifact = implib
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      std::string lib = tgt->GetFullPath(this->Config, artifact, true);
      this->OldLinkDirItems.push_back(lib);
    }
  }

  // Finish setting up linker search directories.
  if (!this->FinishLinkerSearchDirectories()) {
    return false;
  }

  // Add implicit language runtime libraries and directories.
  this->AddImplicitLinkInfo();

  if (!this->CMP0060WarnItems.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0060) << "\n"
      "Some library files are in directories implicitly searched by "
      "the linker when invoked for " << this->LinkLanguage << ":\n"
      " " << cmJoin(this->CMP0060WarnItems, "\n ") << "\n"
      "For compatibility with older versions of CMake, the generated "
      "link line will ask the linker to search for these by library "
      "name."
      ;
    /* clang-format on */
    this->CMakeInstance->IssueMessage(cmake::AUTHOR_WARNING, w.str(),
                                      this->Target->GetBacktrace());
  }

  return true;
}